

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoprism.h
# Opt level: O0

void pzgeom::TPZGeoPrism::X<Fad<double>>
               (TPZFMatrix<double> *nodes,TPZVec<Fad<double>_> *loc,TPZVec<Fad<double>_> *x)

{
  int64_t iVar1;
  TPZVec<Fad<double>_> *in_RDX;
  TPZBaseMatrix *in_RDI;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *extraout_XMM0_Qa;
  int j;
  int i;
  int space;
  TPZFNMatrix<18,_Fad<double>_> dphi;
  TPZFNMatrix<6,_Fad<double>_> phi;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *this;
  Fad<double> *in_stack_fffffffffffffb38;
  Fad<double> *this_00;
  int64_t in_stack_fffffffffffffb48;
  TPZFMatrix<Fad<double>_> *in_stack_fffffffffffffb50;
  FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_> *in_stack_fffffffffffffb58;
  undefined4 in_stack_fffffffffffffb60;
  int iVar2;
  int local_48c;
  double in_stack_fffffffffffffb80;
  Fad<double> *in_stack_fffffffffffffb88;
  TPZFNMatrix<18,_Fad<double>_> *in_stack_fffffffffffffb90;
  
  this_00 = (Fad<double> *)0x6;
  TPZFNMatrix<6,_Fad<double>_>::TPZFNMatrix
            ((TPZFNMatrix<6,_Fad<double>_> *)in_stack_fffffffffffffb90,
             (int64_t)in_stack_fffffffffffffb88,(int64_t)in_stack_fffffffffffffb80);
  TPZFNMatrix<18,_Fad<double>_>::TPZFNMatrix
            (in_stack_fffffffffffffb90,(int64_t)in_stack_fffffffffffffb88,
             (int64_t)in_stack_fffffffffffffb80);
  pztopology::TPZPrism::TShape<Fad<double>>
            ((TPZVec<Fad<double>_> *)dphi.fBuf[8].val_,
             (TPZFMatrix<Fad<double>_> *)dphi.fBuf[7].defaultVal,
             (TPZFMatrix<Fad<double>_> *)dphi.fBuf[7].dx_.ptr_to_data);
  iVar1 = TPZBaseMatrix::Rows(in_RDI);
  for (local_48c = 0; local_48c < (int)iVar1; local_48c = local_48c + 1) {
    TPZVec<Fad<double>_>::operator[](in_RDX,(long)local_48c);
    Fad<double>::operator=<double,_nullptr>(this_00,&in_stack_fffffffffffffb38->val_);
    for (iVar2 = 0; iVar2 < 6; iVar2 = iVar2 + 1) {
      in_stack_fffffffffffffb38 =
           TPZFMatrix<Fad<double>_>::operator()
                     (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48,(int64_t)this_00);
      (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,(long)local_48c,(long)iVar2);
      this = extraout_XMM0_Qa;
      operator*<Fad<double>,_double,_nullptr>(in_stack_fffffffffffffb88,in_stack_fffffffffffffb80);
      TPZVec<Fad<double>_>::operator[](in_RDX,(long)local_48c);
      Fad<double>::operator+=
                ((Fad<double> *)CONCAT44(iVar2,in_stack_fffffffffffffb60),in_stack_fffffffffffffb58)
      ;
      FadExpr<FadBinaryMul<Fad<double>,_FadCst<double>_>_>::~FadExpr(this);
    }
  }
  TPZFNMatrix<18,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<18,_Fad<double>_> *)0x1626c5c);
  TPZFNMatrix<6,_Fad<double>_>::~TPZFNMatrix((TPZFNMatrix<6,_Fad<double>_> *)0x1626c69);
  return;
}

Assistant:

inline void TPZGeoPrism::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<6,T> phi(6,1);
        TPZFNMatrix<18,T> dphi(3,6);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < 6; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }